

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall clipp::group::depth_first_traverser::undo(depth_first_traverser *this,memento *m)

{
  int iVar1;
  const_iterator __last;
  context *pcVar2;
  pointer pcVar3;
  child_t<clipp::parameter,_clipp::group> *pcVar4;
  
  iVar1 = m->level_;
  if (0 < (long)iVar1) {
    __last._M_current =
         (this->stack_).
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pcVar2 = (this->stack_).
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)__last._M_current - (long)pcVar2) / 0x18) < iVar1) {
      if (iVar1 == 1 && pcVar2 == __last._M_current) {
        std::
        vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ::push_back(&this->stack_,&m->context_);
        return;
      }
    }
    else {
      std::
      vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ::erase(&this->stack_,pcVar2 + iVar1,__last);
      pcVar4 = (m->context_).cur._M_current;
      pcVar3 = (this->stack_).
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar3[-1].parent = (m->context_).parent;
      pcVar3[-1].cur._M_current = pcVar4;
      pcVar3[-1].end._M_current = (m->context_).end._M_current;
    }
  }
  return;
}

Assistant:

void undo(const memento& m) {
            if(m.level_ < 1) return;
            if(m.level_ <= int(stack_.size())) {
                stack_.erase(stack_.begin() + m.level_, stack_.end());
                stack_.back() = m.context_;
            }
            else if(stack_.empty() && m.level_ == 1) {
                stack_.push_back(m.context_);
            }
        }